

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O2

variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
* __thiscall
hta::Metric::retrieve_flex
          (variant<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
           *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end,
          Duration interval_upper_limit,IntervalScope scope,bool smooth)

{
  long lVar1;
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  int iVar6;
  Duration DVar7;
  TimeAggregate *__args_1;
  int iVar8;
  pointer pTVar9;
  TimeAggregate *ta;
  TimeAggregate *__args_1_00;
  int iVar10;
  initializer_list<hta::Row> __l;
  long local_120;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> result;
  vector<hta::Row,_std::allocator<hta::Row>_> local_e8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d0;
  vector<hta::TimeValue,_std::allocator<hta::TimeValue>_> raw_ts;
  Aggregate local_60;
  
  check_read(this);
  if ((((long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <
        (long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) && (scope.begin != infinity)) &&
     (((ulong)scope & 0xffffffff00000000) != 0x300000000)) {
    throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
              ("Metric::retrieve(interval_upper_limit) invalid request: begin timestamp ",
               (time_point)
               begin.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r," larger than end timestamp ",
               (time_point)
               end.
               super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               .__d.__r);
  }
  if (interval_upper_limit.__r < 0) {
    aggregate(&local_60,this,begin,end);
    raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_60.minimum;
    __l._M_len = 1;
    __l._M_array = (iterator)&raw_ts;
    raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)end.
                         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         .__d.__r -
                  (long)begin.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r);
    raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)begin.
                  super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  .__d.__r;
    std::vector<hta::Row,_std::allocator<hta::Row>_>::vector
              ((vector<hta::Row,_std::allocator<hta::Row>_> *)&result,__l,
               (allocator_type *)&local_e8);
    *(pointer *)
     &(__return_storage_ptr__->
      super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
      ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u =
         result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
             ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u
     + 8) = result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
             ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
             super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u
     + 0x10) = result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
    ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
    super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
         '\0';
    Catch::clara::std::_Vector_base<hta::Row,_std::allocator<hta::Row>_>::~_Vector_base
              ((_Vector_base<hta::Row,_std::allocator<hta::Row>_> *)&result);
  }
  else {
    local_120 = (this->interval_min_).__r;
    if (interval_upper_limit.__r < local_120) {
      retrieve(&raw_ts,this,begin,end,scope);
      if ((raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
           super__Vector_impl_data._M_start ==
           raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
           super__Vector_impl_data._M_finish) ||
         (!smooth ||
          (ulong)interval_upper_limit.__r <=
          (ulong)((long)end.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        .__d.__r -
                 (long)begin.
                       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       .__d.__r) /
          (ulong)((long)raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4))) {
        *(pointer *)
         &(__return_storage_ptr__->
          super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
          ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u =
             raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u + 8) =
             raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u + 0x10) =
             raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->
        super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
             '\x01';
      }
      else {
        convert_timevalues_smooth
                  ((vector<hta::Row,_std::allocator<hta::Row>_> *)&result,&raw_ts,begin,end,
                   interval_upper_limit);
        *(pointer *)
         &(__return_storage_ptr__->
          super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
          ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u =
             result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u + 8) =
             result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(__return_storage_ptr__->
                 super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                 ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                 _M_u + 0x10) =
             result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->
        super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
             '\0';
        Catch::clara::std::_Vector_base<hta::Row,_std::allocator<hta::Row>_>::~_Vector_base
                  ((_Vector_base<hta::Row,_std::allocator<hta::Row>_> *)&result);
      }
    }
    else {
      lVar1 = (this->interval_max_).__r;
      if (lVar1 < interval_upper_limit.__r) {
        interval_upper_limit.__r = lVar1;
      }
      while (DVar7 = operator*((Duration)local_120,(IntervalFactor)(this->interval_factor_).factor_)
            , DVar7.__r <= interval_upper_limit.__r) {
        local_120 = (long)operator*((Duration)local_120,
                                    (IntervalFactor)(this->interval_factor_).factor_);
      }
      do {
        if (interval_upper_limit.__r < local_120) {
          __assert_fail("interval <= interval_upper_limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                        ,0x18c,
                        "std::variant<std::vector<Row>, std::vector<TimeValue>> hta::Metric::retrieve_flex(TimePoint, TimePoint, Duration, IntervalScope, bool)"
                       );
        }
        _Var2._M_head_impl =
             (this->storage_metric_)._M_t.
             super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
             ._M_t.
             super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
             .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
        (*(_Var2._M_head_impl)->_vptr_Metric[6])
                  (&result,_Var2._M_head_impl,
                   begin.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r,end.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            .__d.__r,local_120,scope);
        pTVar4 = result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pTVar3 = result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            result.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          local_120 = (long)operator/((Duration)local_120,
                                      (IntervalFactor)(this->interval_factor_).factor_);
        }
        else {
          iVar8 = 1;
          if (smooth) {
            iVar8 = (int)(interval_upper_limit.__r / local_120);
          }
          local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_d0.__r = local_120;
          std::vector<hta::Row,_std::allocator<hta::Row>_>::reserve
                    (&local_e8,
                     ((long)iVar8 +
                     (ulong)(((long)result.
                                    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)result.
                                   super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x38) /
                     (ulong)(long)iVar8) - 1);
          pTVar5 = result.
                   super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pTVar9 = result.
                   super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (iVar8 == 1) {
            for (; pTVar9 != pTVar5; pTVar9 = pTVar9 + 1) {
              raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)(pTVar9->time).
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            .__d.__r;
              raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)(pTVar9->aggregate).minimum;
              raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)local_120;
              std::vector<hta::Row,_std::allocator<hta::Row>_>::emplace_back<hta::Row>
                        (&local_e8,(Row *)&raw_ts);
            }
          }
          else {
            if (iVar8 < 2) {
              __assert_fail("smooth_factor > 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                            ,0x147,
                            "std::vector<Row> hta::convert_timeaggregates_to_rows(std::vector<TimeAggregate> &, Duration, int)"
                           );
            }
            iVar10 = 0;
            __args_1_00 = (TimeAggregate *)0x0;
            for (; pTVar9 != pTVar5; pTVar9 = pTVar9 + 1) {
              __args_1 = pTVar9;
              iVar6 = 1;
              if (__args_1_00 != (TimeAggregate *)0x0) {
                Aggregate::operator+=(&__args_1_00->aggregate,pTVar9->aggregate);
                __args_1 = __args_1_00;
                iVar6 = iVar10 + 1;
              }
              iVar10 = iVar6;
              if (iVar10 == iVar8) {
                std::vector<hta::Row,std::allocator<hta::Row>>::
                emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::TimeAggregate&>
                          ((vector<hta::Row,std::allocator<hta::Row>> *)&local_e8,&local_d0,__args_1
                          );
                __args_1 = (TimeAggregate *)0x0;
              }
              __args_1_00 = __args_1;
            }
            if (__args_1_00 != (TimeAggregate *)0x0) {
              std::vector<hta::Row,std::allocator<hta::Row>>::
              emplace_back<std::chrono::duration<long,std::ratio<1l,1000000000l>>&,hta::TimeAggregate&>
                        ((vector<hta::Row,std::allocator<hta::Row>> *)&local_e8,&local_d0,
                         __args_1_00);
            }
          }
          *(pointer *)
           &(__return_storage_ptr__->
            super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
            ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
            super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u =
               local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                   ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                   ._M_u + 8) =
               local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(pointer *)
           ((long)&(__return_storage_ptr__->
                   super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
                   ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
                   super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>
                   ._M_u + 0x10) =
               local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.super__Vector_base<hta::Row,_std::allocator<hta::Row>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->
          super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
          ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
          super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index
               = '\0';
          Catch::clara::std::_Vector_base<hta::Row,_std::allocator<hta::Row>_>::~_Vector_base
                    ((_Vector_base<hta::Row,_std::allocator<hta::Row>_> *)&local_e8);
        }
        std::_Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~_Vector_base
                  (&result.
                    super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>);
        if (pTVar3 != pTVar4) {
          return __return_storage_ptr__;
        }
      } while ((this->interval_min_).__r <= local_120);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               _M_u + 0x10) = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
        ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
        super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_u = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
               ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
               _M_u + 8) = 0;
      raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->
      super__Variant_base<std::vector<hta::Row,_std::allocator<hta::Row>_>,_std::vector<hta::TimeValue,_std::allocator<hta::TimeValue>_>_>
      ).super__Move_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_assign_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Move_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Copy_ctor_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>.
      super__Variant_storage_alias<std::vector<hta::Row>,_std::vector<hta::TimeValue>_>._M_index =
           '\x01';
    }
    std::_Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>::~_Vector_base
              (&raw_ts.super__Vector_base<hta::TimeValue,_std::allocator<hta::TimeValue>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

std::variant<std::vector<Row>, std::vector<TimeValue>>
Metric::retrieve_flex(TimePoint begin, TimePoint end, Duration interval_upper_limit,
                      IntervalScope scope, bool smooth)
{
    check_read();
    if (begin > end && scope.begin != Scope::infinity && scope.end != Scope::infinity)
    {
        throw_exception("Metric::retrieve(interval_upper_limit) invalid request: begin timestamp ",
                        begin, " larger than end timestamp ", end);
    }
    if (interval_upper_limit.count() < 0)
    {
        // Get single aggregate
        return std::vector<Row>{ Row(end - begin, begin, aggregate(begin, end)) };
    }
    if (interval_upper_limit < interval_min_)
    {
        // Use raw data
        auto raw_ts = retrieve(begin, end, scope);
        if (raw_ts.empty())
        {
            return raw_ts;
        }
        auto average_interval = (end - begin) / raw_ts.size();
        if (average_interval < interval_upper_limit && smooth)
        {
            // too many raw data points, must reduce
            // TODO respect scope
            return convert_timevalues_smooth(raw_ts, begin, end, interval_upper_limit);
        }
        return raw_ts;
    }
    auto interval = interval_min_;
    interval_upper_limit = std::min(interval_upper_limit, interval_max_);
    while (interval * interval_factor_ <= interval_upper_limit)
    {
        interval = interval * interval_factor_;
    }
    do
    {
        assert(interval <= interval_upper_limit);
        auto result = storage_metric_->get(begin, end, interval, scope);
        if (!result.empty())
        {
            int smooth_factor = 1;
            if (smooth)
            {
                smooth_factor = interval_upper_limit / interval;
            }
            return convert_timeaggregates_to_rows(result, interval, smooth_factor);
        }
        // If the requested level has no data yet, we must ask the lower levels
        interval = interval / interval_factor_;
    } while (interval >= interval_min_);
    // No data at all
    return std::vector<TimeValue>{};
}